

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha224.c
# Opt level: O1

int SHA224_256ResultN(SHA256Context *context,uint8_t *Message_Digest,int HashSize)

{
  int iVar1;
  byte bVar2;
  ulong uVar3;
  
  iVar1 = 1;
  if ((Message_Digest != (uint8_t *)0x0 && context != (SHA256Context *)0x0) &&
     (iVar1 = context->Corrupted, iVar1 == 0)) {
    if (context->Computed == 0) {
      SHA224_256Finalize(context,0x80);
    }
    if (HashSize < 1) {
      iVar1 = 0;
    }
    else {
      iVar1 = 0;
      bVar2 = 0;
      uVar3 = 0;
      do {
        Message_Digest[uVar3] =
             (uint8_t)(*(uint *)((long)context->Intermediate_Hash +
                                (ulong)((uint)uVar3 & 0xfffffffc)) >> (~bVar2 & 0x18));
        uVar3 = uVar3 + 1;
        bVar2 = bVar2 + 8;
      } while ((uint)HashSize != uVar3);
    }
  }
  return iVar1;
}

Assistant:

static int SHA224_256ResultN(SHA256Context *context, uint8_t Message_Digest[], int HashSize)
{
    int result;
    int i;

    if (!context || !Message_Digest)
    {
        result = shaNull;
    }
    else if (context->Corrupted)
    {
        result = context->Corrupted;
    }
    else
    {
        if (!context->Computed)
        {
            SHA224_256Finalize(context, 0x80);
        }
        for (i = 0; i < HashSize; ++i)
        {
            Message_Digest[i] = (uint8_t)(context->Intermediate_Hash[i >> 2] >> 8 * (3 - (i & 0x03)));
        }
        result = shaSuccess;
    }
    return result;
}